

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O1

void __thiscall QMessageBox::setCheckBox(QMessageBox *this,QCheckBox *cb)

{
  QMessageBoxPrivate *this_00;
  QWidget *this_01;
  QSizePolicy QVar1;
  QLayout *this_02;
  
  this_00 = *(QMessageBoxPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  this_01 = (QWidget *)this_00->checkbox;
  if (this_01 != (QWidget *)cb) {
    if (this_01 != (QWidget *)0x0) {
      QWidget::hide(this_01);
      this_02 = QWidget::layout((QWidget *)this);
      QLayout::removeWidget(this_02,(QWidget *)this_00->checkbox);
      if (*(QMessageBox **)(*(long *)&((QWidget *)this_00->checkbox)->field_0x8 + 0x10) == this) {
        QWidget::setParent((QWidget *)this_00->checkbox,(QWidget *)0x0);
        QObject::deleteLater();
      }
    }
    this_00->checkbox = cb;
    if (cb != (QCheckBox *)0x0) {
      QVar1 = QWidget::sizePolicy((QWidget *)cb);
      QWidget::setSizePolicy
                ((QWidget *)this_00->checkbox,
                 (QSizePolicy)(((uint)QVar1.field_0 & 0xfff0ffff) + 0x30000));
    }
    QMessageBoxPrivate::setupLayout(this_00);
    return;
  }
  return;
}

Assistant:

void QMessageBox::setCheckBox(QCheckBox *cb)
{
    Q_D(QMessageBox);

    if (cb == d->checkbox)
        return;

    if (d->checkbox) {
        d->checkbox->hide();
        layout()->removeWidget(d->checkbox);
        if (d->checkbox->parentWidget() == this) {
            d->checkbox->setParent(nullptr);
            d->checkbox->deleteLater();
        }
    }
    d->checkbox = cb;
    if (d->checkbox) {
        QSizePolicy sp = d->checkbox->sizePolicy();
        sp.setHorizontalPolicy(QSizePolicy::MinimumExpanding);
        d->checkbox->setSizePolicy(sp);
    }
    d->setupLayout();
}